

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

IRNode * __thiscall kratos::SwitchStmt::get_child(SwitchStmt *this,uint64_t index)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [8];
  pointer ppVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  long lVar7;
  element_type *peVar8;
  __normal_iterator<std::pair<unsigned_long,_kratos::IRNode_*>_*,_std::vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>_>
  __i;
  pointer ppVar9;
  pair<unsigned_long,_kratos::ScopedStmtBlock_*> local_60;
  ulong local_50;
  undefined1 auStack_48 [8];
  vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
  cases;
  
  if (index == 0) {
    peVar8 = (this->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else {
    auStack_48 = (undefined1  [8])0x0;
    cases.
    super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cases.
    super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
    ::reserve((vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
               *)auStack_48,(this->body_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_50 = index - 1;
    for (p_Var5 = (this->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        ppVar4 = cases.
                 super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, auVar3 = auStack_48, uVar2 = local_50,
        (_Rb_tree_header *)p_Var5 != &(this->body_)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      local_60.first = 0xffffffffffffffff;
      if (*(long *)(p_Var5 + 1) != 0) {
        local_60.first = *(unsigned_long *)(*(long *)(p_Var5 + 1) + 0x270);
      }
      local_60.second = (ScopedStmtBlock *)p_Var5[1]._M_left;
      std::
      vector<std::pair<unsigned_long,kratos::IRNode*>,std::allocator<std::pair<unsigned_long,kratos::IRNode*>>>
      ::emplace_back<std::pair<unsigned_long,kratos::ScopedStmtBlock*>>
                ((vector<std::pair<unsigned_long,kratos::IRNode*>,std::allocator<std::pair<unsigned_long,kratos::IRNode*>>>
                  *)auStack_48,&local_60);
    }
    if (auStack_48 !=
        (undefined1  [8])
        cases.
        super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar7 = (long)cases.
                    super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48;
      uVar6 = lVar7 >> 4;
      lVar1 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,kratos::IRNode*>*,std::vector<std::pair<unsigned_long,kratos::IRNode*>,std::allocator<std::pair<unsigned_long,kratos::IRNode*>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SwitchStmt::get_child(unsigned_long)::__0>>
                (auStack_48,
                 cases.
                 super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar7 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,kratos::IRNode*>*,std::vector<std::pair<unsigned_long,kratos::IRNode*>,std::allocator<std::pair<unsigned_long,kratos::IRNode*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SwitchStmt::get_child(unsigned_long)::__0>>
                  (auVar3,ppVar4);
      }
      else {
        ppVar9 = (pointer)((long)auVar3 + 0x100);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,kratos::IRNode*>*,std::vector<std::pair<unsigned_long,kratos::IRNode*>,std::allocator<std::pair<unsigned_long,kratos::IRNode*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SwitchStmt::get_child(unsigned_long)::__0>>
                  (auVar3,ppVar9);
        for (; ppVar9 != ppVar4; ppVar9 = ppVar9 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,kratos::IRNode*>*,std::vector<std::pair<unsigned_long,kratos::IRNode*>,std::allocator<std::pair<unsigned_long,kratos::IRNode*>>>>,__gnu_cxx::__ops::_Val_comp_iter<kratos::SwitchStmt::get_child(unsigned_long)::__0>>
                    (ppVar9);
        }
      }
    }
    if (uVar2 < (ulong)((long)cases.
                              super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48 >> 4)) {
      peVar8 = (element_type *)((pointer)((long)auStack_48 + uVar2 * 0x10))->second;
    }
    else {
      peVar8 = (element_type *)0x0;
    }
    std::
    _Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
    ::~_Vector_base((_Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
                     *)auStack_48);
  }
  return &peVar8->super_IRNode;
}

Assistant:

IRNode *SwitchStmt::get_child(uint64_t index) {
    if (index == 0) {
        return target_.get();
    } else {
        // need to make it deterministic
        index--;
        std::vector<std::pair<uint64_t, IRNode *>> cases;
        cases.reserve(body_.size());
        for (auto const &iter : body_) {
            cases.emplace_back(std::make_pair(
                iter.first ? iter.first->value() : std::numeric_limits<uint64_t>::max(),
                iter.second.get()));
        }
        std::sort(cases.begin(), cases.end(),
                  [](auto const &a, auto const &b) { return a.first < b.first; });
        if (index < cases.size()) {
            return cases[index].second;
        }
        return nullptr;
    }
}